

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

int main(void)

{
  int local_11c;
  duration<long,_std::ratio<1L,_1L>_> local_118;
  function<void_(std::function<void_()>)> local_110;
  anon_class_1_0_00000001 local_e9;
  OnFileHandle local_e8;
  allocator local_b1;
  string local_b0 [32];
  undefined1 local_90 [8];
  Monitor monitor;
  
  monitor.paths_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,".",&local_b1);
  std::function<void(DirMonitor::Event)>::function<main::__0,void>
            ((function<void(DirMonitor::Event)> *)&local_e8,&local_e9);
  std::function<void_(std::function<void_()>)>::function(&local_110,(nullptr_t)0x0);
  DirMonitor::Monitor::Monitor((Monitor *)local_90,(string *)local_b0,&local_e8,&local_110);
  std::function<void_(std::function<void_()>)>::~function(&local_110);
  std::function<void_(DirMonitor::Event)>::~function(&local_e8);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  do {
    local_11c = 1;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_118,&local_11c);
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_118);
  } while( true );
}

Assistant:

int main() {
    Monitor monitor(".", [](const Event& event) {
        LOGI("Monitor: path:%s, type:%s, isAdd:%s",
                event.path.name.c_str(),
                event.path.isDir ? "dir" : "file",
                event.type == Event::Type::ADD ? "add" : "remove"
                );
    });
    for(;;) { std::this_thread::sleep_for(std::chrono::seconds(1)); };
    return 0;
}